

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::AdamOptimizer::AdamOptimizer(AdamOptimizer *this,AdamOptimizer *from)

{
  ulong uVar1;
  DoubleParameter *pDVar2;
  Int64Parameter *from_00;
  DoubleParameter *pDVar3;
  Int64Parameter *this_00;
  
  (this->super_MessageLite)._internal_metadata_.ptr_ = 0;
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__AdamOptimizer_004b9f50;
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  uVar1 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar1 & 0xfffffffffffffffc) + 8));
  }
  pDVar2 = from->learningrate_;
  if (pDVar2 == (DoubleParameter *)0x0 || from == (AdamOptimizer *)_AdamOptimizer_default_instance_)
  {
    pDVar3 = (DoubleParameter *)0x0;
  }
  else {
    pDVar3 = (DoubleParameter *)operator_new(0x28);
    DoubleParameter::DoubleParameter(pDVar3,pDVar2);
  }
  this->learningrate_ = pDVar3;
  from_00 = from->minibatchsize_;
  if (from_00 == (Int64Parameter *)0x0 || from == (AdamOptimizer *)_AdamOptimizer_default_instance_)
  {
    this_00 = (Int64Parameter *)0x0;
  }
  else {
    this_00 = (Int64Parameter *)operator_new(0x28);
    Int64Parameter::Int64Parameter(this_00,from_00);
  }
  this->minibatchsize_ = this_00;
  pDVar2 = from->beta1_;
  if (pDVar2 == (DoubleParameter *)0x0 || from == (AdamOptimizer *)_AdamOptimizer_default_instance_)
  {
    pDVar3 = (DoubleParameter *)0x0;
  }
  else {
    pDVar3 = (DoubleParameter *)operator_new(0x28);
    DoubleParameter::DoubleParameter(pDVar3,pDVar2);
  }
  this->beta1_ = pDVar3;
  pDVar2 = from->beta2_;
  if (pDVar2 == (DoubleParameter *)0x0 || from == (AdamOptimizer *)_AdamOptimizer_default_instance_)
  {
    pDVar3 = (DoubleParameter *)0x0;
  }
  else {
    pDVar3 = (DoubleParameter *)operator_new(0x28);
    DoubleParameter::DoubleParameter(pDVar3,pDVar2);
  }
  this->beta2_ = pDVar3;
  pDVar2 = from->eps_;
  if (pDVar2 == (DoubleParameter *)0x0 || from == (AdamOptimizer *)_AdamOptimizer_default_instance_)
  {
    pDVar3 = (DoubleParameter *)0x0;
  }
  else {
    pDVar3 = (DoubleParameter *)operator_new(0x28);
    DoubleParameter::DoubleParameter(pDVar3,pDVar2);
  }
  this->eps_ = pDVar3;
  return;
}

Assistant:

AdamOptimizer::AdamOptimizer(const AdamOptimizer& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite() {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  if (from._internal_has_learningrate()) {
    learningrate_ = new ::CoreML::Specification::DoubleParameter(*from.learningrate_);
  } else {
    learningrate_ = nullptr;
  }
  if (from._internal_has_minibatchsize()) {
    minibatchsize_ = new ::CoreML::Specification::Int64Parameter(*from.minibatchsize_);
  } else {
    minibatchsize_ = nullptr;
  }
  if (from._internal_has_beta1()) {
    beta1_ = new ::CoreML::Specification::DoubleParameter(*from.beta1_);
  } else {
    beta1_ = nullptr;
  }
  if (from._internal_has_beta2()) {
    beta2_ = new ::CoreML::Specification::DoubleParameter(*from.beta2_);
  } else {
    beta2_ = nullptr;
  }
  if (from._internal_has_eps()) {
    eps_ = new ::CoreML::Specification::DoubleParameter(*from.eps_);
  } else {
    eps_ = nullptr;
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.AdamOptimizer)
}